

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf_dist_histogram_converter_impl.h
# Opt level: O0

int __thiscall
leaf_dist_histogram_converter::Converter<label::StringLabel>::create_leaf_dist_histrogram
          (Converter<label::StringLabel> *this,Node<label::StringLabel> *tree_node,
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *leaf_dist_histogram,int *tree_size)

{
  bool bVar1;
  int iVar2;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_> *this_00;
  reference tree_node_00;
  mapped_type *pmVar3;
  int child_dist;
  Node<label::StringLabel> *child;
  const_iterator __end0;
  const_iterator __begin0;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_> *__range2
  ;
  int *piStack_28;
  int max_child_leaf_dist;
  int *tree_size_local;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *leaf_dist_histogram_local;
  Node<label::StringLabel> *tree_node_local;
  Converter<label::StringLabel> *this_local;
  
  __range2._4_4_ = 0;
  piStack_28 = tree_size;
  tree_size_local = (int *)leaf_dist_histogram;
  leaf_dist_histogram_local =
       (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
        *)tree_node;
  tree_node_local = (Node<label::StringLabel> *)this;
  this_00 = node::Node<label::StringLabel>::get_children(tree_node);
  __end0 = std::
           vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           ::begin(this_00);
  child = (Node<label::StringLabel> *)
          std::
          vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
          end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
                                *)&child);
    if (!bVar1) break;
    tree_node_00 = __gnu_cxx::
                   __normal_iterator<const_node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
                   ::operator*(&__end0);
    iVar2 = create_leaf_dist_histrogram
                      (this,tree_node_00,
                       (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        *)tree_size_local,piStack_28);
    if (__range2._4_4_ < iVar2) {
      __range2._4_4_ = iVar2;
    }
    __gnu_cxx::
    __normal_iterator<const_node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
    ::operator++(&__end0);
  }
  __range2._4_4_ = __range2._4_4_ + 1;
  pmVar3 = std::
           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)tree_size_local,(key_type *)((long)&__range2 + 4));
  *pmVar3 = *pmVar3 + 1;
  if (this->max_leaf_distance_ < __range2._4_4_) {
    this->max_leaf_distance_ = __range2._4_4_;
  }
  *piStack_28 = *piStack_28 + 1;
  return __range2._4_4_;
}

Assistant:

int Converter<Label>::create_leaf_dist_histrogram(
    const node::Node<Label>& tree_node, 
    std::unordered_map<int, int>& leaf_dist_histogram, int& tree_size) {

  // the leaf distance is the minimum leaf distance of a nodes children + 1
  int max_child_leaf_dist = 0;
  // do recursively for all children
  for (const auto& child: tree_node.get_children()) {
    int child_dist = create_leaf_dist_histrogram(child, leaf_dist_histogram, tree_size);
    if(max_child_leaf_dist < child_dist)
      max_child_leaf_dist = child_dist;
  }
  // the leaf distance is the minimum leaf distance of a nodes children + 1
  ++max_child_leaf_dist;
  // increase leaf distance count for current node
  ++leaf_dist_histogram[max_child_leaf_dist];
  // store maximum leaf distance of the collection
  if(max_child_leaf_dist > max_leaf_distance_)
    max_leaf_distance_ = max_child_leaf_dist;
  // increase tree size
  ++tree_size;

  return max_child_leaf_dist;
}